

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statistics.h
# Opt level: O2

void __thiscall CompilerStatistics::Finish(CompilerStatistics *this,char *keyName,uint timeMicros)

{
  uint uVar1;
  bool bVar2;
  size_t sVar3;
  Timer *pTVar4;
  uint i;
  uint index;
  InplaceStr key;
  
  this->finishTime = timeMicros;
  key.begin = keyName;
  sVar3 = strlen(keyName);
  key.end = keyName + sVar3;
  index = 0;
  while( true ) {
    if ((this->timers).count <= index) {
      __assert_fail("!\"unknown timer\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Statistics.h"
                    ,0x39,"void CompilerStatistics::Finish(const char *, unsigned int)");
    }
    pTVar4 = SmallArray<CompilerStatistics::Timer,_16U>::operator[](&this->timers,index);
    bVar2 = InplaceStr::operator==(&pTVar4->keyName,&key);
    if (bVar2) break;
    index = index + 1;
  }
  uVar1 = this->startTime;
  pTVar4 = SmallArray<CompilerStatistics::Timer,_16U>::operator[](&this->timers,index);
  pTVar4->total = pTVar4->total + (timeMicros - uVar1);
  this->startTime = 0;
  return;
}

Assistant:

void Finish(const char *keyName, unsigned timeMicros)
	{
		finishTime = timeMicros;

		InplaceStr key = InplaceStr(keyName);

		for(unsigned i = 0; i < timers.size(); i++)
		{
			if(timers[i].keyName == key)
			{
				timers[i].total += timeMicros - startTime;

				startTime = 0;
				return;
			}
		}

		assert(!"unknown timer");
	}